

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_movq_env_0(DisasContext *s,int d_offset)

{
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(s->tmp1_i64 + (long)tcg_ctx),0);
  tcg_gen_op3_x86_64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(s->tmp1_i64 + (long)tcg_ctx),
                     (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)d_offset);
  return;
}

Assistant:

static inline void gen_op_movq_env_0(DisasContext *s, int d_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_movi_i64(tcg_ctx, s->tmp1_i64, 0);
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, d_offset);
}